

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ConditionalRenderInverted::CoverageTest::test(CoverageTest *this,GLenum mode)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  GLchar *pGVar4;
  bool bVar5;
  undefined1 local_1a0 [384];
  long lVar3;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar3 + 0x18))(this->m_qo_id,mode);
  bVar1 = true;
  do {
    bVar5 = bVar1;
    iVar2 = (**(code **)(lVar3 + 0x800))();
    bVar1 = false;
  } while (iVar2 != 0);
  if (bVar5) {
    (**(code **)(lVar3 + 0x620))();
    err = (**(code **)(lVar3 + 0x800))();
    glu::checkError(err,"glEndConditionalRender() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                    ,199);
  }
  else {
    local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"glBeginConditionalRender failed when used with mode ");
    pGVar4 = Utilities::modeToChars(mode);
    std::operator<<((ostream *)this_00,pGVar4);
    std::operator<<((ostream *)this_00,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return bVar5;
}

Assistant:

bool gl4cts::ConditionalRenderInverted::CoverageTest::test(glw::GLenum mode)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Default return value;*/
	bool is_no_error = true;

	/* Test. */
	gl.beginConditionalRender(m_qo_id, mode);

	while (GL_NO_ERROR != gl.getError())
	{
		is_no_error = false;
	}

	/* Clean up. */
	if (is_no_error)
	{
		gl.endConditionalRender();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndConditionalRender() call failed.");
	}

	/* Logging. */
	if (!is_no_error)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glBeginConditionalRender failed when used with mode "
											<< Utilities::modeToChars(mode) << "." << tcu::TestLog::EndMessage;
	}

	/* Return test result. */
	return is_no_error;
}